

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffc2ii(char *cval,long *ival,int *status)

{
  int *piVar1;
  long lVar2;
  char *loc;
  char msg [81];
  byte *local_90;
  char local_88 [96];
  
  if (0 < *status) {
    return *status;
  }
  piVar1 = __errno_location();
  *piVar1 = 0;
  *ival = 0;
  lVar2 = strtol(cval,(char **)&local_90,10);
  *ival = lVar2;
  if ((*local_90 & 0xdf) != 0) {
    *status = 0x197;
  }
  if (*piVar1 == 0x22) {
    builtin_strncpy(local_88,"Range Error in ffc2ii converting string to long int: ",0x36);
    strncat(local_88,cval,0x19);
    ffxmsg(5,local_88);
    *status = 0x19c;
    *piVar1 = 0;
  }
  return *status;
}

Assistant:

int ffc2ii(const char *cval,  /* I - string representation of the value */
          long *ival,         /* O - numerical value of the input string */
          int *status)        /* IO - error status */
/*
  convert null-terminated formatted string to an integer value
*/
{
    char *loc, msg[81];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    errno = 0;
    *ival = 0;
    *ival = strtol(cval, &loc, 10);  /* read the string as an integer */

    /* check for read error, or junk following the integer */
    if (*loc != '\0' && *loc != ' ' ) 
        *status = BAD_C2I;

    if (errno == ERANGE)
    {
        strcpy(msg,"Range Error in ffc2ii converting string to long int: ");
        strncat(msg,cval,25);
        ffpmsg(msg);

        *status = NUM_OVERFLOW;
        errno = 0;
    }

    return(*status);
}